

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectiveParser.cpp
# Opt level: O2

bool __thiscall Refal2::CDirectiveParser::StartParseIfDirective(CDirectiveParser *this)

{
  CToken *moveTo;
  uint __line;
  TDirectiveType TVar1;
  code *pcVar2;
  char *__assertion;
  
  if ((this->super_CRuleParser).super_CQualifierParser.token.type != TT_Word) {
    __assertion = "token.type == TT_Word";
    __line = 0x47;
LAB_001221c4:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/DirectiveParser.cpp"
                  ,__line,"bool Refal2::CDirectiveParser::StartParseIfDirective()");
  }
  TVar1 = findDirective(&(this->super_CRuleParser).super_CQualifierParser.token.word);
  if (TVar1 == DT_None) goto LAB_0012219c;
  CRuleParser::EndFunction(&this->super_CRuleParser);
  (this->super_CRuleParser).super_CQualifierParser.super_CParsingElementState.state =
       PES_NotFinished;
  moveTo = &this->directive;
  CToken::Move(&(this->super_CRuleParser).super_CQualifierParser.token,moveTo);
  switch(TVar1) {
  case DT_Start:
    this->state = S_Simple;
    CModuleBuilder::StartModule((CModuleBuilder *)this,moveTo);
    goto LAB_0012219c;
  case DT_End:
    this->state = S_Simple;
    CModuleBuilder::EndModule((CModuleBuilder *)this,moveTo);
    goto LAB_0012219c;
  case DT_Empty:
    this->state = S_OneName;
    pcVar2 = addEmpty;
    break;
  case DT_External:
    this->state = S_TwoNames;
    pcVar2 = addExternal;
    break;
  case DT_Entry:
    this->state = S_TwoNames;
    pcVar2 = addEntry;
    break;
  default:
    __assertion = "false";
    __line = 100;
    goto LAB_001221c4;
  }
  this->handler = (THandler)pcVar2;
  *(undefined8 *)&this->field_0x1ef0 = 0;
LAB_0012219c:
  return TVar1 != DT_None;
}

Assistant:

bool CDirectiveParser::StartParseIfDirective()
{
	assert( token.type == TT_Word );
	TDirectiveType directiveType = findDirective( token.word );
	if( directiveType != DT_None ) {
		CRuleParser::EndFunction();
		CParsingElementState::Reset();
		token.Move( directive );
		switch( directiveType ) {
			case DT_Start:
				state = S_Simple;
				CModuleBuilder::StartModule( directive );
				break;
			case DT_End:
				state = S_Simple;
				CModuleBuilder::EndModule( directive );
				break;
			case DT_Empty:
				state = S_OneName;
				handler = &CDirectiveParser::addEmpty;
				break;
			case DT_External:
				state = S_TwoNames;
				handler = &CDirectiveParser::addExternal;
				break;
			case DT_Entry:
				state = S_TwoNames;
				handler = &CDirectiveParser::addEntry;
				break;
			case DT_None:
			default:
				assert( false );
				break;
		}
		return true;
	}
	return false;
}